

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week4-app2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int i;
  long lVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  int N;
  Vector<float> v5;
  Vector<int> v3;
  Vector<double> v4;
  Vector<int> v1;
  Vector<int> v2;
  uint local_5c;
  Vector<float> local_58;
  Vector<int> local_48;
  Vector<double> local_38;
  Vector<int> local_28;
  Vector<int> local_18;
  
  local_5c = 0;
  std::istream::operator>>((istream *)&std::cin,(int *)&local_5c);
  Vector<int>::Vector(&local_28,local_5c);
  for (lVar1 = 0; lVar1 < (int)local_5c; lVar1 = lVar1 + 1) {
    local_28.values[lVar1] = 3;
  }
  Vector<int>::Vector(&local_18,&local_28);
  Vector<int>::print(&local_18);
  Vector<int>::Vector(&local_48,local_5c);
  print<int>(&local_48);
  Vector<int>::operator=(&local_48,&local_28);
  print<int>(&local_48);
  Vector<double>::Vector(&local_38,local_5c);
  uVar4 = 0;
  uVar2 = (ulong)local_5c;
  if ((int)local_5c < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    local_38.values[uVar4] = 3.14;
  }
  print<double>(&local_38);
  Vector<float>::Vector(&local_58,local_5c);
  uVar4 = 0;
  uVar2 = (ulong)local_5c;
  if ((int)local_5c < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    local_58.values[uVar4] = 3.14;
  }
  print<float>(&local_58);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_58.values);
  std::endl<char,std::char_traits<char>>(poVar3);
  Vector<float>::~Vector(&local_58);
  Vector<double>::~Vector(&local_38);
  Vector<int>::~Vector(&local_48);
  Vector<int>::~Vector(&local_18);
  Vector<int>::~Vector(&local_28);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    // There is a std::cin object meaning console input. Use it for reading an integer from console.
    //   { int N; std::cin >> N; } defines an integer, reads an integer from the keyboard and
    //   stores it in variable "N".
    auto N = 0;
    std::cin >> N;

    // Create an "N" dimensional vector by "IntVector v1(N)" or equivalently "auto v1 = IntVector(N)".
    // If, for instance, N is entered as 5, this creates an IntVector instance that can store 5 different integer values
    //   (use new operator for dynamic memory allocation).
    auto v1 = Vector<int>(N);

    // Use v1.set(...) method for N times via a for loop to
    //   initialize the IntVector instance's contents to 1, 2, ..., N respectively.
    for(int i=0; i<N; ++i)
        v1.set(i, 3.14);

    // Use copy-constructor by "auto v2 = IntVector(v1);"
    auto v2 = Vector<int>(v1);

    // Write v2's contents by "v2.print();" (The output shall be 1, 2, 3, ..., N)
    //   where N is the number entered from the keyboard at program's start.
    v2.print();

    // Create v3 by "auto v3 = IntVector(N);". Print it "v3.print();". Result is "0, 0, ..., 0"
    auto v3 = Vector<int>(N);
    print(v3);

    //"v3 = v1; v3.print();" Result shall be 1, 2, 3, ..., N if you did everything correctly.
    v3 = v1;
    print(v3);

    auto v4 = Vector<double>(N);
    for(int i=0; i<N; ++i)
        v4.set(i, 3.14);
    print(v4);

    auto v5 = Vector<float>(N);
    for(int i=0; i<N; ++i)
        v5.set(i, 3.14f);
    print(v5);

    std::cout << v5[0] << std::endl;

    return 0;
}